

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Prepare16(sqlite3 *db,void *zSql,int nBytes,u32 prepFlags,sqlite3_stmt **ppStmt,
                    void **pzTail)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *zSql_00;
  u8 enc;
  byte *pbVar4;
  byte *pbVar5;
  char *zTail8;
  char *local_38;
  
  enc = (u8)prepFlags;
  local_38 = (char *)0x0;
  *ppStmt = (sqlite3_stmt *)0x0;
  iVar1 = sqlite3SafetyCheckOk(db);
  if ((zSql == (void *)0x0) || (iVar1 == 0)) {
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x22416,
                "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c");
    return 0x15;
  }
  if (-1 < nBytes) {
    if (nBytes == 0) {
      nBytes = 0;
    }
    else {
      lVar3 = 0;
      do {
        if ((*(char *)((long)zSql + lVar3) == '\0') && (*(char *)((long)zSql + lVar3 + 1) == '\0'))
        break;
        lVar3 = lVar3 + 2;
      } while ((int)lVar3 < nBytes);
      nBytes = (int)lVar3;
    }
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  zSql_00 = sqlite3Utf16to8(db,zSql,nBytes,enc);
  iVar1 = 0;
  if (zSql_00 != (char *)0x0) {
    iVar1 = sqlite3LockAndPrepare(db,zSql_00,-1,prepFlags,(Vdbe *)0x0,ppStmt,&local_38);
    if (pzTail != (void **)0x0 && local_38 != (char *)0x0) {
      iVar2 = sqlite3Utf8CharLen(zSql_00,(int)local_38 - (int)zSql_00);
      pbVar4 = (byte *)((long)zSql + 1);
      if (iVar2 < 1) {
        *pzTail = (void *)((long)(int)((int)(byte *)((long)zSql + 1) + ~(uint)zSql) + (long)zSql);
      }
      else {
        do {
          pbVar5 = pbVar4 + 2;
          if (((*pbVar4 & 0xfc) == 0xd8) && ((pbVar4[2] & 0xfc) == 0xdc)) {
            pbVar5 = pbVar4 + 4;
          }
          iVar2 = iVar2 + -1;
          pbVar4 = pbVar5;
        } while (iVar2 != 0);
        *pzTail = (void *)((long)(int)((int)pbVar5 + ~(uint)zSql) + (long)zSql);
        if (zSql_00 == (char *)0x0) goto LAB_00127e95;
      }
    }
    sqlite3DbFreeNN(db,zSql_00);
  }
LAB_00127e95:
  iVar2 = 0;
  if ((iVar1 != 0) || (db->mallocFailed != '\0')) {
    iVar2 = apiHandleError(db,iVar1);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar2;
}

Assistant:

static int sqlite3Prepare16(
  sqlite3 *db,              /* Database handle. */
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  /* This function currently works by first transforming the UTF-16
  ** encoded string to UTF-8, then invoking sqlite3_prepare(). The
  ** tricky bit is figuring out the pointer to return in *pzTail.
  */
  char *zSql8;
  const char *zTail8 = 0;
  int rc = SQLITE_OK;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  if( nBytes>=0 ){
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; sz<nBytes && (z[sz]!=0 || z[sz+1]!=0); sz += 2){}
    nBytes = sz;
  }
  sqlite3_mutex_enter(db->mutex);
  zSql8 = sqlite3Utf16to8(db, zSql, nBytes, SQLITE_UTF16NATIVE);
  if( zSql8 ){
    rc = sqlite3LockAndPrepare(db, zSql8, -1, prepFlags, 0, ppStmt, &zTail8);
  }

  if( zTail8 && pzTail ){
    /* If sqlite3_prepare returns a tail pointer, we calculate the
    ** equivalent pointer into the UTF-16 string by counting the unicode
    ** characters between zSql8 and zTail8, and then returning a pointer
    ** the same number of characters into the UTF-16 string.
    */
    int chars_parsed = sqlite3Utf8CharLen(zSql8, (int)(zTail8-zSql8));
    *pzTail = (u8 *)zSql + sqlite3Utf16ByteLen(zSql, chars_parsed);
  }
  sqlite3DbFree(db, zSql8);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}